

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void test_many<int>(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  ulong uVar8;
  random_numerators<int> data;
  TestResult local_1b0;
  char type_buffer [64];
  char local_138 [264];
  
  snprintf(type_buffer,0x40,"=== libdivide %s benchmark ===","s32");
  snprintf(local_138,0x80,"\n%50s\n\n",type_buffer);
  std::operator<<((ostream *)&std::cout,local_138);
  print_report_header();
  random_numerators<int>::random_numerators(&data);
  uVar8 = 1;
  do {
    test_one<int>(&local_1b0,(int)uVar8,&data);
    iVar7 = local_1b0.algo;
    dVar6 = local_1b0.gen_time;
    dVar5 = local_1b0.vector_branchfree_time;
    dVar4 = local_1b0.vector_time;
    dVar3 = local_1b0.branchfree_time;
    dVar2 = local_1b0.base_time;
    dVar1 = local_1b0.hardware_time;
    snprintf(type_buffer,0x20,"%d",uVar8);
    snprintf(local_138,0x100,"%6s %10.3f %10.3f %10.3f %10.3f %10.3f %10.3f %4d\n",dVar1,dVar2,dVar3
             ,dVar4,dVar5,dVar6,type_buffer,(ulong)(uint)iVar7);
    std::operator<<((ostream *)&std::cout,local_138);
    uVar8 = (ulong)(uint)((int)(uVar8 >> 0x1f) - (int)uVar8);
  } while( true );
}

Assistant:

static void print_banner() {
    char type_buffer[64];
    snprintf(type_buffer, sizeof type_buffer,
        "=== libdivide %s benchmark ===", type_tag<_IntT>::get_tag());
    char buffer[128];
    snprintf(buffer, sizeof buffer, "\n%50s\n\n", type_buffer);
    PRINT_INFO(buffer);
}